

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

BinOpr expr_binop(LexState *ls,ExpDesc *v,uint32_t limit)

{
  int iVar1;
  BCPos BVar2;
  ExpKind EVar3;
  FuncState *pFVar4;
  anon_union_8_3_2ce71dea_for_u aVar5;
  bool bVar6;
  uint uVar7;
  BinOpr BVar8;
  BCReg BVar9;
  BCReg BVar10;
  BCReg BVar11;
  BCPos BVar12;
  undefined4 uVar13;
  TValue TVar14;
  undefined8 uVar15;
  ulong uVar16;
  anon_union_8_3_2ce71dea_for_u *paVar17;
  uint32_t uVar18;
  BCPos *l1;
  BCIns ins;
  TValue *o;
  BinOpr BVar19;
  GCstr *pGVar20;
  ExpDesc v2;
  anon_union_8_3_2ce71dea_for_u *local_60;
  anon_union_8_3_2ce71dea_for_u local_58;
  int iStack_50;
  BCPos BStack_4c;
  BCPos local_48;
  undefined4 uStack_44;
  uint32_t local_3c;
  BCPos *local_38;
  
  uVar7 = ls->level + 1;
  ls->level = uVar7;
  local_3c = limit;
  if (199 < uVar7) {
    lj_lex_error(ls,0,LJ_ERR_XLEVELS);
  }
  iVar1 = ls->tok;
  if (iVar1 < 0x114) {
    if (0x106 < iVar1) {
      switch(iVar1) {
      case 0x107:
        uVar15 = 0xffffffff00000001;
        break;
      default:
        goto switchD_0012c643_caseD_108;
      case 0x109:
        lj_lex_next(ls);
        parse_body(ls,v,0,ls->linenumber);
        goto LAB_0012c925;
      case 0x10e:
        uVar15 = 0xffffffff00000000;
        break;
      case 0x10f:
        uVar7 = 0x13;
        goto LAB_0012c7c2;
      }
LAB_0012c76e:
      v->k = (int)uVar15;
      v->t = (int)((ulong)uVar15 >> 0x20);
      (v->u).s.info = 0;
      v->f = 0xffffffff;
      goto LAB_0012c7a9;
    }
    if (iVar1 == 0x23) {
      uVar7 = 0x15;
    }
    else {
      if (iVar1 != 0x2d) {
        if (iVar1 != 0x7b) goto switchD_0012c643_caseD_108;
        expr_table(ls,v);
        goto LAB_0012c925;
      }
      uVar7 = 0x14;
    }
LAB_0012c7c2:
    lj_lex_next(ls);
    expr_binop(ls,v,8);
    pFVar4 = ls->fs;
    if (uVar7 == 0x14) {
      if (v->t == v->f) {
        if (v->k == VKLAST) {
          if (((ulong)(v->u).sval & 0x7fffffffffffffff) == 0) goto LAB_0012c8eb;
          (v->u).sval = (GCstr *)((ulong)(v->u).sval ^ 0x8000000000000000);
        }
        else {
          if (v->k != VKCDATA) goto LAB_0012c8eb;
          uVar16 = (ulong)(v->u).s.info;
          if (*(short *)(uVar16 + 6) == 0x10) {
            *(byte *)(uVar16 + 0x17) = *(byte *)(uVar16 + 0x17) ^ 0x80;
          }
          else {
            *(long *)(uVar16 + 8) = -*(long *)(uVar16 + 8);
          }
        }
        goto LAB_0012c925;
      }
LAB_0012c8eb:
      expr_toanyreg(pFVar4,v);
LAB_0012c8f6:
      if ((v->k == VNONRELOC) && (pFVar4->nactvar <= (v->u).s.info)) {
        pFVar4->freereg = pFVar4->freereg - 1;
      }
      BVar12 = bcemit_INS(pFVar4,(v->u).s.info << 0x10 | uVar7);
      (v->u).s.info = BVar12;
      v->k = VRELOCABLE;
    }
    else {
      if (uVar7 != 0x13) goto LAB_0012c8eb;
      BVar12 = v->t;
      BVar2 = v->f;
      v->f = BVar12;
      v->t = BVar2;
      jmp_dropval(pFVar4,BVar12);
      jmp_dropval(pFVar4,v->t);
      expr_discharge(pFVar4,v);
      EVar3 = v->k;
      if (VKFALSE < EVar3) {
        if (EVar3 < VLOCAL) {
          v->k = VKFALSE;
          goto LAB_0012c925;
        }
        if (EVar3 == VJMP) {
          *(byte *)&pFVar4->bcbase[(v->u).s.info - 1].ins =
               (byte)pFVar4->bcbase[(v->u).s.info - 1].ins ^ 1;
          goto LAB_0012c925;
        }
        if (EVar3 == VRELOCABLE) {
          bcreg_reserve(pFVar4,1);
          *(char *)((long)&pFVar4->bcbase[(v->u).s.info].ins + 1) = (char)pFVar4->freereg + -1;
          (v->u).s.info = pFVar4->freereg - 1;
          v->k = VNONRELOC;
        }
        goto LAB_0012c8f6;
      }
      v->k = VKTRUE;
    }
  }
  else {
    if (iVar1 < 0x11e) {
      if (iVar1 == 0x114) {
        uVar15 = 0xffffffff00000002;
        goto LAB_0012c76e;
      }
      if (iVar1 != 0x118) {
switchD_0012c643_caseD_108:
        expr_primary(ls,v);
        goto LAB_0012c925;
      }
      pFVar4 = ls->fs;
      if ((pFVar4->flags & 2) == 0) {
        err_syntax(ls,LJ_ERR_XDOTS);
      }
      bcreg_reserve(pFVar4,1);
      uVar18 = pFVar4->freereg - 1;
      BVar12 = bcemit_INS(pFVar4,(uint)pFVar4->numparams << 0x10 | uVar18 * 0x100 | 0x2000047);
      v->k = VCALL;
      (v->u).s.info = BVar12;
      v->t = 0xffffffff;
      v->f = 0xffffffff;
      (v->u).s.aux = uVar18;
    }
    else {
      if (iVar1 == 0x11e) {
        v->k = (ls->tokval).field_2.it == 0xfffffff5 | VKLAST;
        (v->u).s.info = 0;
        v->t = 0xffffffff;
        v->f = 0xffffffff;
        TVar14 = ls->tokval;
      }
      else {
        if (iVar1 != 0x120) goto switchD_0012c643_caseD_108;
        v->k = VKSTR;
        v->t = 0xffffffff;
        (v->u).s.info = 0;
        v->f = 0xffffffff;
        TVar14.field_2.it = 0;
        TVar14.field_2.field_0 =
             (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)
             (ls->tokval).u32.lo;
      }
      v->u = (anon_union_8_3_2ce71dea_for_u)TVar14;
    }
LAB_0012c7a9:
    lj_lex_next(ls);
  }
LAB_0012c925:
  iVar1 = ls->tok;
  if (iVar1 < 0x5e) {
    switch(iVar1) {
    case 0x25:
      BVar19 = OPR_MOD;
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x2e:
switchD_0012c943_caseD_26:
      BVar19 = OPR_NOBINOPR;
      bVar6 = true;
      goto LAB_0012c9fd;
    case 0x2a:
      BVar19 = OPR_MUL;
      break;
    case 0x2b:
      bVar6 = false;
      BVar19 = OPR_ADD;
      goto LAB_0012c9fd;
    case 0x2d:
      BVar19 = OPR_SUB;
      break;
    case 0x2f:
      BVar19 = OPR_DIV;
      break;
    default:
      if (iVar1 == 0x3c) {
        BVar19 = OPR_LT;
      }
      else {
        if (iVar1 != 0x3e) goto switchD_0012c943_caseD_26;
        BVar19 = OPR_GT;
      }
    }
  }
  else {
    switch(iVar1) {
    case 0x110:
      BVar19 = OPR_OR;
      break;
    case 0x111:
    case 0x112:
    case 0x113:
    case 0x114:
    case 0x115:
    case 0x116:
    case 0x118:
      goto switchD_0012c943_caseD_26;
    case 0x117:
      BVar19 = OPR_CONCAT;
      break;
    case 0x119:
      BVar19 = OPR_EQ;
      break;
    case 0x11a:
      BVar19 = OPR_GE;
      break;
    case 0x11b:
      BVar19 = OPR_LE;
      break;
    case 0x11c:
      BVar19 = OPR_NE;
      break;
    default:
      if (iVar1 == 0x5e) {
        BVar19 = OPR_POW;
      }
      else {
        if (iVar1 != 0x101) goto switchD_0012c943_caseD_26;
        BVar19 = OPR_AND;
      }
    }
  }
  bVar6 = false;
LAB_0012c9fd:
  if (!bVar6) {
    local_38 = &v->t;
    do {
      if (priority[BVar19].left <= local_3c) break;
      lj_lex_next(ls);
      pFVar4 = ls->fs;
      if (BVar19 == OPR_CONCAT) {
        expr_tonextreg(pFVar4,v);
      }
      else if (BVar19 == OPR_OR) {
        expr_discharge(pFVar4,v);
        EVar3 = v->k;
        if (EVar3 - VKTRUE < 3) {
          expr_toreg_nobranch(pFVar4,v,0xff);
          BVar12 = bcemit_jmp(pFVar4);
        }
        else {
          BVar12 = 0xffffffff;
          if (VKFALSE < EVar3) {
            if (EVar3 == VJMP) {
              BVar12 = (v->u).s.info;
            }
            else {
              BVar12 = bcemit_branch(pFVar4,v,1);
            }
          }
        }
        jmp_append(pFVar4,local_38,BVar12);
        BVar12 = v->f;
        pFVar4->lasttarget = pFVar4->pc;
        jmp_append(pFVar4,&pFVar4->jpc,BVar12);
        v->f = 0xffffffff;
      }
      else if (BVar19 == OPR_AND) {
        bcemit_branch_t(pFVar4,v);
      }
      else {
        if (BVar19 - OPR_NE < 2) {
          if (v->k < VKCDATA) {
LAB_0012caba:
            if (v->t == v->f) goto LAB_0012cb2d;
          }
        }
        else if (v->k == VKLAST) goto LAB_0012caba;
        expr_toanyreg(pFVar4,v);
      }
LAB_0012cb2d:
      local_60 = &local_58;
      BVar8 = expr_binop(ls,(ExpDesc *)&local_60->s,(uint)priority[BVar19].right);
      pFVar4 = ls->fs;
      if (BVar19 < OPR_CONCAT) {
        if ((((v->k == VKLAST) && (v->t == v->f)) && (iStack_50 == 4)) &&
           ((BStack_4c == local_48 &&
            (pGVar20 = (GCstr *)lj_vm_foldarith(v->u,(double)CONCAT44(local_58.s.aux,local_58.s.info
                                                                     ),BVar19),
            ((ulong)pGVar20 & 0x7fffffffffffffff) < 0x7ff0000000000001)))) {
          (v->u).sval = pGVar20;
        }
        else {
          if (BVar19 == OPR_POW) {
            BVar9 = expr_toanyreg(pFVar4,(ExpDesc *)&local_60->s);
            BVar10 = expr_toanyreg(pFVar4,v);
            BVar19 = 0x25;
          }
          else {
            expr_toval(pFVar4,(ExpDesc *)&local_60->s);
            if ((iStack_50 == 4) &&
               (BVar11 = const_num(pFVar4,(ExpDesc *)&local_60->s), BVar11 < 0x100)) {
              BVar19 = BVar19 + 0x16;
            }
            else {
              BVar19 = BVar19 | 0x20;
              BVar11 = expr_toanyreg(pFVar4,(ExpDesc *)&local_60->s);
            }
            expr_toval(pFVar4,v);
            if (((v->k == VKLAST) && (iStack_50 != 4)) &&
               (BVar9 = const_num(pFVar4,v), BVar9 < 0x100)) {
              BVar19 = BVar19 - OPR_POW;
              BVar10 = BVar11;
            }
            else {
              BVar10 = expr_toanyreg(pFVar4,v);
              BVar9 = BVar11;
            }
          }
          if ((v->k == VNONRELOC) && (pFVar4->nactvar <= (v->u).s.info)) {
            pFVar4->freereg = pFVar4->freereg - 1;
          }
          if ((iStack_50 == 0xc) && (pFVar4->nactvar <= local_58.s.info)) {
            pFVar4->freereg = pFVar4->freereg - 1;
          }
          BVar12 = bcemit_INS(pFVar4,BVar9 << 0x10 | BVar10 << 0x18 | BVar19);
          (v->u).s.info = BVar12;
          v->k = VRELOCABLE;
        }
      }
      else if (BVar19 == OPR_CONCAT) {
        expr_toval(pFVar4,(ExpDesc *)&local_60->s);
        if (iStack_50 == 0xb) {
          if ((char)pFVar4->bcbase[local_58.s.info].ins != '&') goto LAB_0012cdef;
          if ((v->k == VNONRELOC) && (pFVar4->nactvar <= (v->u).s.info)) {
            pFVar4->freereg = pFVar4->freereg - 1;
          }
          *(undefined1 *)((long)&pFVar4->bcbase[local_58.s.info].ins + 3) = *(undefined1 *)&v->u;
          uVar13 = local_58.s.info;
        }
        else {
LAB_0012cdef:
          expr_tonextreg(pFVar4,(ExpDesc *)&local_60->s);
          if ((iStack_50 == 0xc) && (pFVar4->nactvar <= local_58.s.info)) {
            pFVar4->freereg = pFVar4->freereg - 1;
          }
          if ((v->k == VNONRELOC) && (pFVar4->nactvar <= (v->u).s.info)) {
            pFVar4->freereg = pFVar4->freereg - 1;
          }
          uVar13 = bcemit_INS(pFVar4,local_58.s.info << 0x10 | (v->u).s.info << 0x18 | 0x26);
        }
        (v->u).s.info = uVar13;
        v->k = VRELOCABLE;
      }
      else {
        if (BVar19 == OPR_OR) {
          expr_discharge(pFVar4,(ExpDesc *)&local_60->s);
          BVar12 = v->t;
          l1 = &BStack_4c;
        }
        else {
          if (BVar19 != OPR_AND) {
            expr_toval(pFVar4,v);
            paVar17 = &v->u;
            if (BVar19 - OPR_NE < 2) {
              uVar7 = BVar19 == OPR_EQ ^ 5;
              if (v->k < VKCDATA) {
                paVar17 = local_60;
                local_60 = &v->u;
              }
              BVar11 = expr_toanyreg(pFVar4,(ExpDesc *)&paVar17->s);
              expr_toval(pFVar4,(ExpDesc *)&local_60->s);
              EVar3 = local_60[1].s.info;
              if (EVar3 < VKSTR) {
                ins = EVar3 << 0x10 | uVar7 + BVar11 * 0x100 + 6;
              }
              else if (EVar3 == VKSTR) {
                BVar9 = const_gc(pFVar4,(GCobj *)((anon_union_8_3_2ce71dea_for_u *)
                                                 &(local_60->s).info)->sval,0xfffffffb);
                ins = (BVar9 << 0x10 | BVar11 << 8) + uVar7 + 2;
              }
              else {
                if (EVar3 == VKLAST) {
                  uVar7 = uVar7 + BVar11 * 0x100 + 4;
                  BVar9 = const_num(pFVar4,(ExpDesc *)&local_60->s);
                  goto LAB_0012cee3;
                }
                BVar9 = expr_toanyreg(pFVar4,(ExpDesc *)&local_60->s);
                ins = BVar9 << 0x10 | BVar11 * 0x100 | uVar7;
              }
            }
            else {
              uVar7 = BVar19 - OPR_LT;
              if ((uVar7 & 1) == 0) {
                BVar9 = expr_toanyreg(pFVar4,(ExpDesc *)&local_60->s);
                BVar11 = expr_toanyreg(pFVar4,v);
              }
              else {
                uVar7 = uVar7 ^ 3;
                expr_toval(pFVar4,(ExpDesc *)&local_60->s);
                BVar11 = expr_toanyreg(pFVar4,(ExpDesc *)&local_60->s);
                BVar9 = expr_toanyreg(pFVar4,v);
                paVar17 = local_60;
                local_60 = &v->u;
              }
              uVar7 = BVar11 << 8 | uVar7;
LAB_0012cee3:
              ins = BVar9 << 0x10 | uVar7;
            }
            if ((paVar17[1].s.info == VNONRELOC) &&
               (pFVar4->nactvar <= (((anon_union_8_3_2ce71dea_for_u *)&(paVar17->s).info)->s).info))
            {
              pFVar4->freereg = pFVar4->freereg - 1;
            }
            if ((local_60[1].s.info == VNONRELOC) &&
               (pFVar4->nactvar <= (((anon_union_8_3_2ce71dea_for_u *)&(local_60->s).info)->s).info)
               ) {
              pFVar4->freereg = pFVar4->freereg - 1;
            }
            bcemit_INS(pFVar4,ins);
            BVar12 = bcemit_jmp(pFVar4);
            (v->u).s.info = BVar12;
            v->k = VJMP;
            goto LAB_0012cf39;
          }
          expr_discharge(pFVar4,(ExpDesc *)&local_60->s);
          BVar12 = v->f;
          l1 = &local_48;
        }
        jmp_append(pFVar4,l1,BVar12);
        *(ulong *)&v->f = CONCAT44(uStack_44,local_48);
        aVar5.s.aux = local_58.s.aux;
        aVar5.s.info = local_58.s.info;
        v->u = aVar5;
        v->k = iStack_50;
        v->t = BStack_4c;
      }
LAB_0012cf39:
      BVar19 = BVar8;
    } while (BVar8 != OPR_NOBINOPR);
  }
  ls->level = ls->level - 1;
  return BVar19;
}

Assistant:

static BinOpr expr_binop(LexState *ls, ExpDesc *v, uint32_t limit)
{
  BinOpr op;
  synlevel_begin(ls);
  expr_unop(ls, v);
  op = token2binop(ls->tok);
  while (op != OPR_NOBINOPR && priority[op].left > limit) {
    ExpDesc v2;
    BinOpr nextop;
    lj_lex_next(ls);
    bcemit_binop_left(ls->fs, op, v);
    /* Parse binary expression with higher priority. */
    nextop = expr_binop(ls, &v2, priority[op].right);
    bcemit_binop(ls->fs, op, v, &v2);
    op = nextop;
  }
  synlevel_end(ls);
  return op;  /* Return unconsumed binary operator (if any). */
}